

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkAssignmentToItself(CheckerVisitor *this,BinExpr *expr)

{
  Expr *e;
  bool bVar1;
  Node *lhs;
  Node *rhs;
  
  if ((this->effectsOnly == false) && ((expr->super_Expr).super_Node._op == TO_ASSIGN)) {
    e = expr->_rhs;
    lhs = &deparen(expr->_lhs)->super_Node;
    rhs = &deparen(e)->super_Node;
    bVar1 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,lhs,rhs);
    if (bVar1) {
      report(this,(Node *)expr,0x40);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkAssignmentToItself(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_ASSIGN) {
    auto *ll = deparen(l);
    auto *rr = deparen(r);

    if (_equalChecker.check(ll, rr)) {
      report(expr, DiagnosticsId::DI_ASG_TO_ITSELF);
    }
  }
}